

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O0

int mk_fifo_destroy(mk_fifo *ctx)

{
  mk_fifo *ctx_local;
  
  mk_fifo_queue_destroy_all(ctx);
  mk_fifo_worker_destroy_all(ctx);
  mk_mem_free(ctx);
  return 0;
}

Assistant:

int mk_fifo_destroy(struct mk_fifo *ctx)
{
    mk_fifo_queue_destroy_all(ctx);
    mk_fifo_worker_destroy_all(ctx);
    mk_mem_free(ctx);
    return 0;
}